

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *this)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  reference pvVar4;
  logic_error *plVar5;
  size_type sVar6;
  anon_class_8_1_ba1d7400 local_40;
  anon_class_8_1_ba1d7400 fun;
  allocator<unsigned_long> local_25;
  int local_24;
  int local_20;
  undefined1 local_19;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *local_18;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *res;
  
  local_18 = this;
  this_local = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)__return_storage_ptr__;
  bVar2 = is_empty(this);
  if (bVar2) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  }
  else {
    local_19 = 0;
    local_20 = upper_bound_dimension(this);
    local_20 = local_20 + 1;
    local_24 = max_dimension();
    local_24 = local_24 + 1;
    piVar3 = std::min<int>(&local_20,&local_24);
    iVar1 = *piVar3;
    std::allocator<unsigned_long>::allocator(&local_25);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,(long)iVar1,&local_25);
    std::allocator<unsigned_long>::~allocator(&local_25);
    local_40.res = __return_storage_ptr__;
    for_each_simplex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension()const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)_1_&>
              (this,&local_40);
    if ((this->dimension_to_be_lowered_ & 1U) == 0) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         (__return_storage_ptr__);
      if (*pvVar4 == 0) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar5,
                   "Bug in Gudhi: there is no simplex of dimension the dimension of the complex");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                         (__return_storage_ptr__);
      if (*pvVar4 == 0) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"Bug in Gudhi: non-empty complex has no vertex");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      while (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                (__return_storage_ptr__), *pvVar4 == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(__return_storage_ptr__)
        ;
      }
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (__return_storage_ptr__);
      this->dimension_ = (int)sVar6 + -1;
      this->dimension_to_be_lowered_ = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> num_simplices_by_dimension() const {
    if (is_empty()) return {};
    // std::min in case the upper bound got crazy
    std::vector<size_t> res(std::min(upper_bound_dimension()+1, max_dimension()+1));
    auto fun = [&res](Simplex_handle, int dim) -> void { ++res[dim]; };
    for_each_simplex(fun);
    if (dimension_to_be_lowered_) {
      GUDHI_CHECK(res.front() != 0, std::logic_error("Bug in Gudhi: non-empty complex has no vertex"));
      while (res.back() == 0) res.pop_back();
      dimension_ = static_cast<int>(res.size()) - 1;
      dimension_to_be_lowered_ = false;
    } else {
      GUDHI_CHECK(res.back() != 0,
          std::logic_error("Bug in Gudhi: there is no simplex of dimension the dimension of the complex"));
    }
    return res;
  }